

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

utf8_size_t utf8_trimmed_length(utf8_char_t *data,utf8_size_t charcters)

{
  long lVar1;
  utf8_size_t uVar2;
  byte bVar3;
  ulong uVar4;
  utf8_size_t uVar5;
  bool bVar6;
  
  bVar3 = *data;
  if (charcters == 0 || bVar3 == 0) {
    return 0;
  }
  uVar2 = 0;
  uVar5 = 0;
  uVar4 = 1;
  while( true ) {
    if (((bVar3 < 0x21) || (bVar3 == 0x7f)) || ((bVar3 == 0xc2 && (data[1] == -0x60)))) {
      bVar6 = false;
    }
    else {
      bVar6 = true;
    }
    lVar1 = *(long *)((long)utf8_char_length::_utf8_char_length + (ulong)(bVar3 & 0xf8));
    uVar5 = uVar5 + lVar1;
    if (bVar6) {
      uVar2 = uVar5;
    }
    bVar3 = data[lVar1];
    if (bVar3 == 0) break;
    data = data + lVar1;
    bVar6 = charcters <= uVar4;
    uVar4 = uVar4 + 1;
    if (bVar6) {
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

size_t utf8_trimmed_length(const utf8_char_t* data, utf8_size_t charcters)
{
    size_t l, t = 0, split_at = 0;
    for (size_t c = 0; (*data) && c < charcters; ++c) {
        l = utf8_char_length(data);
        if (!utf8_char_whitespace(data)) {
            split_at = t + l;
        }
         t += l, data += l;
    }

    return split_at;
}